

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

void __thiscall
Js::Type::SetAreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties(Type *this,bool truth)

{
  int iVar1;
  undefined7 in_register_00000031;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> local_20;
  
  if ((int)CONCAT71(in_register_00000031,truth) == 0) {
    this->flags = this->flags &
                  (TypeFlagMask_HasBeenCached|TypeFlagMask_JsrtExternal|
                   TypeFlagMask_ThisAndPrototypesHaveNoSpecialProperties|TypeFlagMask_SkipsPrototype
                   |TypeFlagMask_EngineExternal|TypeFlagMask_HasSpecialPrototype|
                  TypeFlagMask_IsFalsy);
  }
  else {
    iVar1 = (*(((((this->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
    if ((char)iVar1 == '\0') {
      this->flags = this->flags |
                    TypeFlagMask_AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties;
      Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
      WriteBarrierSet(&local_20,
                      &((this->javascriptLibrary).ptr)->typesWithOnlyWritablePropertyProtoChain);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Register(local_20.ptr,this);
    }
  }
  return;
}

Assistant:

void Type::SetAreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties(const bool truth)
    {
        if (truth)
        {
            if (GetScriptContext()->IsClosed())
            {
                // The cache is disabled after the script context is closed, to avoid issues between being closed and being deleted,
                // where the cache of these types in JavascriptLibrary may be reclaimed at any point
                return;
            }

            flags |= TypeFlagMask_AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties;
            javascriptLibrary->GetTypesWithOnlyWritablePropertyProtoChainCache()->Register(this);
        }
        else
        {
            flags &= ~TypeFlagMask_AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties;
        }
    }